

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

void __thiscall olc::PixelGameEngine::SetDrawTarget(PixelGameEngine *this,uint8_t layer)

{
  pointer pLVar1;
  undefined3 in_register_00000031;
  ulong uVar2;
  
  uVar2 = (ulong)CONCAT31(in_register_00000031,layer);
  pLVar1 = (this->vLayers).super__Vector_base<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (uVar2 < (ulong)(((long)(this->vLayers).
                             super__Vector_base<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pLVar1) / 0x68)) {
    this->pDrawTarget = pLVar1[uVar2].pDrawTarget;
    pLVar1[uVar2].bUpdate = true;
    this->nTargetLayer = layer;
  }
  return;
}

Assistant:

void PixelGameEngine::SetDrawTarget(uint8_t layer)
	{
		if (layer < vLayers.size())
		{
			pDrawTarget = vLayers[layer].pDrawTarget;
			vLayers[layer].bUpdate = true;
			nTargetLayer = layer;
		}
	}